

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSiteNameCommand.cxx
# Opt level: O0

bool __thiscall
cmSiteNameCommand::InitialPass
          (cmSiteNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  ulong uVar6;
  string local_260;
  undefined1 local_240 [8];
  RegularExpression hostReg;
  string local_168 [8];
  string hostRegExp;
  undefined1 local_140 [8];
  string host;
  string local_118 [8];
  string siteName;
  undefined1 local_d8 [8];
  string hostname_cmd;
  string local_b0;
  char *local_90;
  char *temp;
  char *local_80;
  char *cacheValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmSiteNameCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cacheValue);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [9])"/usr/bsd");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[10]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [10])"/usr/sbin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [9])"/usr/bin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [5])0x7d8b70);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[6]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [6])0x7d8b57);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[15]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cacheValue,
               (char (*) [15])"/usr/local/bin");
    pcVar1 = (this->super_cmCommand).Makefile;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    local_80 = cmMakefile::GetDefinition(pcVar1,pvVar4);
    if (local_80 == (char *)0x0) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"HOSTNAME",
                 (allocator<char> *)(hostname_cmd.field_2._M_local_buf + 0xf));
      pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(hostname_cmd.field_2._M_local_buf + 0xf))
      ;
      local_90 = pcVar5;
      std::__cxx11::string::string((string *)local_d8);
      if (local_90 == (char *)0x0) {
        cmsys::SystemTools::FindProgram
                  ((string *)((long)&siteName.field_2 + 8),"hostname",
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&cacheValue,false);
        std::__cxx11::string::operator=
                  ((string *)local_d8,(string *)(siteName.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(siteName.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::operator=((string *)local_d8,local_90);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_118,"unknown",(allocator<char> *)(host.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(host.field_2._M_local_buf + 0xf));
      bVar2 = cmSystemTools::IsOff((string *)local_d8);
      if (!bVar2) {
        std::__cxx11::string::string((string *)local_140);
        hostRegExp.field_2._8_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        cmSystemTools::RunSingleCommand
                  ((string *)local_d8,(string *)local_140,(string *)0x0,(int *)0x0,(char *)0x0,
                   OUTPUT_NONE,(cmDuration)hostRegExp.field_2._8_8_);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_168,"[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*",
                     (allocator<char> *)&hostReg.field_0xcf);
          std::allocator<char>::~allocator((allocator<char> *)&hostReg.field_0xcf);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::RegularExpression((RegularExpression *)local_240,pcVar5);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmsys::RegularExpression::find((RegularExpression *)local_240,pcVar5);
          if (bVar2) {
            cmsys::RegularExpression::match_abi_cxx11_(&local_260,(RegularExpression *)local_240,1);
            std::__cxx11::string::operator=((string *)local_140,(string *)&local_260);
            std::__cxx11::string::~string((string *)&local_260);
          }
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::__cxx11::string::operator=(local_118,(string *)local_140);
          }
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_240);
          std::__cxx11::string::~string(local_168);
        }
        std::__cxx11::string::~string((string *)local_140);
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,pvVar4,pcVar5,"Name of the computer/site where compile is being run",STRING,
                 false);
      this_local._7_1_ = 1;
      temp._4_4_ = 1;
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string((string *)local_d8);
    }
    else {
      this_local._7_1_ = 1;
      temp._4_4_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cacheValue);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSiteNameCommand::InitialPass(std::vector<std::string> const& args,
                                    cmExecutionStatus&)
{
  if (args.size() != 1) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string> paths;
  paths.emplace_back("/usr/bsd");
  paths.emplace_back("/usr/sbin");
  paths.emplace_back("/usr/bin");
  paths.emplace_back("/bin");
  paths.emplace_back("/sbin");
  paths.emplace_back("/usr/local/bin");

  const char* cacheValue = this->Makefile->GetDefinition(args[0]);
  if (cacheValue) {
    return true;
  }

  const char* temp = this->Makefile->GetDefinition("HOSTNAME");
  std::string hostname_cmd;
  if (temp) {
    hostname_cmd = temp;
  } else {
    hostname_cmd = cmSystemTools::FindProgram("hostname", paths);
  }

  std::string siteName = "unknown";
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string host;
  if (cmSystemTools::ReadRegistryValue(
        "HKEY_LOCAL_MACHINE\\System\\CurrentControlSet\\"
        "Control\\ComputerName\\ComputerName;ComputerName",
        host)) {
    siteName = host;
  }
#else
  // try to find the hostname for this computer
  if (!cmSystemTools::IsOff(hostname_cmd)) {
    std::string host;
    cmSystemTools::RunSingleCommand(hostname_cmd, &host, nullptr, nullptr,
                                    nullptr, cmSystemTools::OUTPUT_NONE);

    // got the hostname
    if (!host.empty()) {
      // remove any white space from the host name
      std::string hostRegExp = "[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*";
      cmsys::RegularExpression hostReg(hostRegExp.c_str());
      if (hostReg.find(host.c_str())) {
        // strip whitespace
        host = hostReg.match(1);
      }

      if (!host.empty()) {
        siteName = host;
      }
    }
  }
#endif
  this->Makefile->AddCacheDefinition(
    args[0], siteName.c_str(),
    "Name of the computer/site where compile is being run",
    cmStateEnums::STRING);

  return true;
}